

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_totals.hpp
# Opt level: O1

Totals * __thiscall
Catch::Totals::delta(Totals *__return_storage_ptr__,Totals *this,Totals *prevTotals)

{
  long *plVar1;
  long lVar2;
  
  operator-(__return_storage_ptr__,this,prevTotals);
  lVar2 = 0x20;
  if ((__return_storage_ptr__->assertions).failed == 0) {
    lVar2 = (ulong)((__return_storage_ptr__->assertions).failedButOk != 0) * 0x10 + 0x18;
  }
  plVar1 = (long *)((long)&(__return_storage_ptr__->assertions).passed + lVar2);
  *plVar1 = *plVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

Totals delta( Totals const& prevTotals ) const {
            Totals diff = *this - prevTotals;
            if( diff.assertions.failed > 0 )
                ++diff.testCases.failed;
            else if( diff.assertions.failedButOk > 0 )
                ++diff.testCases.failedButOk;
            else
                ++diff.testCases.passed;
            return diff;
        }